

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_bitset.hpp
# Opt level: O3

bool __thiscall
boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::m_check_invariants
          (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *this)

{
  pointer puVar1;
  pointer puVar2;
  ulong uVar3;
  
  puVar1 = (this->m_bits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (this->m_bits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar3 = this->m_num_bits & 0x3f;
  if (uVar3 != 0) {
    if (puVar2 == puVar1) {
      __assert_fail("size() > 0 && num_blocks() > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kgori[P]tree_distance/src/include/boost/dynamic_bitset/dynamic_bitset.hpp"
                    ,0x71c,
                    "const Block &boost::dynamic_bitset<>::m_highest_block() const [Block = unsigned long, Allocator = std::allocator<unsigned long>]"
                   );
    }
    if (puVar2[-1] >> (sbyte)uVar3 != 0) {
      return false;
    }
  }
  if ((ulong)((long)(this->m_bits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1) <
      (ulong)((long)puVar2 - (long)puVar1)) {
    return false;
  }
  return (long)puVar2 - (long)puVar1 >> 3 == ((this->m_num_bits >> 6) + 1) - (ulong)(uVar3 == 0);
}

Assistant:

inline typename dynamic_bitset<Block, Allocator>::size_type
dynamic_bitset<Block, Allocator>::size() const BOOST_NOEXCEPT
{
    return m_num_bits;
}